

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

bool __thiscall
Jinx::Impl::Parser::CheckFunctionSignature
          (Parser *this,SymbolListCItr currSym,FunctionSignature *signature,size_t *symCount)

{
  pointer pFVar1;
  pointer pbVar2;
  int iVar3;
  Symbol *pSVar4;
  pointer pFVar5;
  pointer this_00;
  bool bVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  if (symCount != (size_t *)0x0) {
    *symCount = 0;
  }
  pFVar5 = (signature->m_parts).
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (signature->m_parts).
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar9 = pFVar5 != pFVar1;
  if (pFVar5 == pFVar1) {
    lVar8 = 0;
  }
  else {
    lVar7 = 0;
    do {
      if (((this->m_error == false) &&
          ((this->m_symbolList->
           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
           super__Vector_impl_data._M_finish != currSym._M_current)) &&
         ((currSym._M_current)->type != NewLine)) {
        if (pFVar5->partType == Parameter) {
          if ((currSym._M_current)->type != CurlyOpen) goto LAB_0012c9dc;
          pSVar4 = currSym._M_current + 1;
          lVar8 = lVar7 + 1;
          if (((this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish != pSVar4) && (pSVar4->type != NewLine)) {
            if (((this->m_symbolList->
                 super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_finish != pSVar4) &&
               (((ulong)pSVar4->type < 0x3f &&
                ((0x40308c0c80000000U >> ((ulong)pSVar4->type & 0x3f) & 1) != 0)))) {
              pSVar4 = currSym._M_current + 2;
              lVar8 = lVar7 + 2;
              currSym._M_current = pSVar4;
              lVar7 = lVar8;
              if (((this->m_symbolList->
                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                   _M_impl.super__Vector_impl_data._M_finish == pSVar4) || (pSVar4->type == NewLine)
                 ) goto LAB_0012c9dc;
            }
            if (pSVar4->type == CurlyClose) goto LAB_0012cb27;
          }
          bVar6 = false;
        }
        else {
          this_00 = (pFVar5->names).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (pFVar5->names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pSVar4 = currSym._M_current;
          lVar8 = lVar7;
          if (this_00 == pbVar2) {
LAB_0012cb1a:
            if (pFVar5->optional != true) goto LAB_0012c9dc;
          }
          else {
            do {
              iVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::compare
                                (this_00,&(currSym._M_current)->text);
              bVar6 = false;
              if (iVar3 == 0) {
                bVar6 = true;
                break;
              }
              this_00 = this_00 + 1;
            } while (this_00 != pbVar2);
            if (!bVar6) goto LAB_0012cb1a;
          }
LAB_0012cb27:
          pSVar4 = pSVar4 + 1;
          lVar8 = lVar8 + 1;
          bVar6 = true;
        }
      }
      else {
LAB_0012c9dc:
        bVar6 = false;
        pSVar4 = currSym._M_current;
        lVar8 = lVar7;
      }
      if (!bVar6) break;
      pFVar5 = pFVar5 + 1;
      bVar9 = pFVar5 != pFVar1;
      currSym._M_current = pSVar4;
      lVar7 = lVar8;
    } while (bVar9);
  }
  if (!(bool)(symCount == (size_t *)0x0 | bVar9)) {
    *symCount = *symCount + lVar8;
  }
  return (bool)~bVar9;
}

Assistant:

inline_t bool Parser::CheckFunctionSignature(SymbolListCItr currSym, const FunctionSignature & signature, size_t * symCount) const
	{
		size_t count = 0;
		if (symCount)
			*symCount = 0;
		for (const auto & part : signature.GetParts())
		{
			if (!IsSymbolValid(currSym))
				return false;
			if (part.partType == FunctionSignaturePartType::Parameter)
			{
				if (currSym->type != SymbolType::CurlyOpen)
					return false;
				++currSym;
				++count;
				if (!IsSymbolValid(currSym))
					return false;
				if (CheckValueType(currSym))
				{
					++currSym;
					++count;
					if (!IsSymbolValid(currSym))
						return false;
				}
				if (currSym->type != SymbolType::CurlyClose)
					return false;
			}
			else
			{
				bool matched = false;
				for (const auto & name : part.names)
				{
					if (name == currSym->text)
					{
						matched = true;
						break;
					}
				}
				if (!matched && !part.optional)
					return false;
			}
			++currSym;
			++count;
		}
		if (symCount)
			*symCount += count;
		return true;
	}